

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

int Abc_NodeMinimumBase2(Abc_Obj_t *pNode)

{
  void *pvVar1;
  DdNode *bF;
  int iVar2;
  int iVar3;
  uint Entry;
  Vec_Str_t *vSupport_00;
  Vec_Ptr_t *vNodes;
  DdNode *pDVar4;
  int local_34;
  int nVars;
  int i;
  DdNode *bTemp;
  Vec_Ptr_t *vFanins;
  Vec_Str_t *vSupport;
  Abc_Obj_t *pNode_local;
  
  iVar2 = Abc_NtkIsBddLogic(pNode->pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                  ,0x3f,"int Abc_NodeMinimumBase2(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsNode(pNode);
  if (iVar2 != 0) {
    vSupport_00 = Vec_StrAlloc(10);
    pvVar1 = (pNode->field_5).pData;
    iVar2 = Abc_ObjFaninNum(pNode);
    iVar2 = Abc_NodeSupport((DdNode *)((ulong)pvVar1 & 0xfffffffffffffffe),vSupport_00,iVar2);
    iVar3 = Abc_ObjFaninNum(pNode);
    if (iVar2 == iVar3) {
      Vec_StrFree(vSupport_00);
      pNode_local._4_4_ = 0;
    }
    else {
      iVar3 = Abc_ObjFaninNum(pNode);
      vNodes = Vec_PtrAlloc(iVar3);
      Abc_NodeCollectFanins(pNode,vNodes);
      Vec_IntClear(&pNode->vFanins);
      for (local_34 = 0; local_34 < vNodes->nSize; local_34 = local_34 + 1) {
        if (vSupport_00->pArray[local_34] != '\0') {
          Entry = Abc_ObjId((Abc_Obj_t *)vNodes->pArray[local_34]);
          Vec_IntPush(&pNode->vFanins,Entry);
        }
      }
      iVar3 = Abc_ObjFaninNum(pNode);
      if (iVar2 != iVar3) {
        __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                      ,0x52,"int Abc_NodeMinimumBase2(Abc_Obj_t *)");
      }
      bF = (DdNode *)(pNode->field_5).pData;
      pDVar4 = Extra_bddRemapUp((DdManager *)pNode->pNtk->pManFunc,bF);
      (pNode->field_5).pData = pDVar4;
      Cudd_Ref((DdNode *)(pNode->field_5).pData);
      Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,bF);
      Vec_PtrFree(vNodes);
      Vec_StrFree(vSupport_00);
      pNode_local._4_4_ = 1;
    }
    return pNode_local._4_4_;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                ,0x40,"int Abc_NodeMinimumBase2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeMinimumBase2( Abc_Obj_t * pNode )
{
    Vec_Str_t * vSupport;
    Vec_Ptr_t * vFanins;
    DdNode * bTemp;
    int i, nVars;

    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );

    // compute support
    vSupport = Vec_StrAlloc( 10 );
    nVars = Abc_NodeSupport( Cudd_Regular(pNode->pData), vSupport, Abc_ObjFaninNum(pNode) );
    if ( nVars == Abc_ObjFaninNum(pNode) )
    {
        Vec_StrFree( vSupport );
        return 0;
    }

    // add fanins
    vFanins = Vec_PtrAlloc( Abc_ObjFaninNum(pNode) );
    Abc_NodeCollectFanins( pNode, vFanins );
    Vec_IntClear( &pNode->vFanins );
    for ( i = 0; i < vFanins->nSize; i++ )
        if ( vSupport->pArray[i] != 0 ) // useful
            Vec_IntPush( &pNode->vFanins, Abc_ObjId((Abc_Obj_t *)vFanins->pArray[i]) );
    assert( nVars == Abc_ObjFaninNum(pNode) );

    // update the function of the node
    pNode->pData = Extra_bddRemapUp( (DdManager *)pNode->pNtk->pManFunc, bTemp = (DdNode *)pNode->pData );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, bTemp );
    Vec_PtrFree( vFanins );
    Vec_StrFree( vSupport );
    return 1;
}